

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_command_runner.cc
# Opt level: O0

bool __thiscall PosixCommandRunner::Finished(PosixCommandRunner *this)

{
  bool bVar1;
  __pid_t _Var2;
  bool local_2a;
  uint local_1c;
  pid_t res;
  int stat;
  PosixCommandRunner *this_local;
  
  if (-1 < this->current_process_) {
    _res = this;
    _Var2 = waitpid(this->current_process_,(int *)&local_1c,1);
    if ((_Var2 == 0) || (bVar1 = false, _Var2 == this->current_process_)) {
      bVar1 = true;
    }
    if (!bVar1) {
      __assert_fail("(res == 0 || res == current_process_) && \"Unexpected return value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/posix_command_runner.cc"
                    ,0x1e,"virtual bool PosixCommandRunner::Finished()");
    }
    if (_Var2 == 0) {
      return false;
    }
    this->current_process_ = -1;
    local_2a = (local_1c & 0x7f) != 0 || (int)(local_1c & 0xff00) >> 8 != 0;
    this->previous_command_failed_ = local_2a;
  }
  return true;
}

Assistant:

bool PosixCommandRunner::Finished() {
  if (current_process_ >= 0) {
    // Command may still be running. Ask the kernel for the exit status.
    int stat;
    pid_t res = waitpid(current_process_, &stat, WNOHANG);
    assert((res == 0 || res == current_process_) && "Unexpected return value");
    if (res == 0)
      return false;

    // Command has just terminated. Store whether it has failed.
    current_process_ = -1;
    previous_command_failed_ = !WIFEXITED(stat) || WEXITSTATUS(stat) != 0;
  }
  return true;
}